

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

leb_Node leb_DecodeNode(leb_Heap *leb,uint32_t nodeID)

{
  uint32_t uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar1 = leb_NodeCount(leb);
  if (nodeID < uVar1) {
    uVar2 = 1;
    lVar3 = 0;
    while( true ) {
      uVar1 = leb__HeapRead(leb,(leb_Node)(uVar2 + lVar3));
      if (uVar1 < 2) break;
      lVar3 = lVar3 + 0x100000000;
      uVar1 = leb__HeapRead(leb,(leb_Node)((ulong)(uint)((int)uVar2 * 2) + lVar3));
      uVar2 = (ulong)((uint)(uVar1 <= nodeID) + (int)uVar2 * 2);
      if (uVar1 > nodeID) {
        uVar1 = 0;
      }
      nodeID = nodeID - uVar1;
    }
    return (leb_Node)(uVar2 + lVar3);
  }
  __assert_fail("nodeID < leb_NodeCount(leb) && \"nodeID > NodeCount(leb)\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                ,0x300,"leb_Node leb_DecodeNode(const leb_Heap *, uint32_t)");
}

Assistant:

LEBDEF leb_Node leb_DecodeNode(const leb_Heap *leb, uint32_t nodeID)
{
    LEB_ASSERT(nodeID < leb_NodeCount(leb) && "nodeID > NodeCount(leb)");

    leb_Node node = {1u, 0};

    while (leb__HeapRead(leb, node) > 1u) {
        uint32_t cmp = leb__HeapRead(leb, {node.id<<= 1u, ++node.depth});
        uint32_t b = nodeID < cmp ? 0 : 1;

        node.id|= b;
        nodeID-= cmp * b;
    }

    return node;
}